

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

bool __thiscall Uniforms::haveChange(Uniforms *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  pointer ppVar3;
  size_type sVar4;
  byte local_109;
  iterator local_e8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
  local_e0;
  iterator local_d8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
  local_d0;
  const_iterator it;
  key_type local_c0;
  byte local_9b;
  byte local_9a;
  allocator local_99;
  key_type local_98;
  byte local_73;
  byte local_72;
  allocator local_71;
  key_type local_70;
  allocator local_39;
  key_type local_38;
  Uniforms *local_18;
  Uniforms *this_local;
  
  if (((this->super_Scene).activeCamera == (Camera *)0x0) ||
     (((((this->super_Scene).activeCamera)->super_Node).bChange & 1U) == 0)) {
    local_18 = this;
    std::allocator<char>::allocator();
    local_72 = 0;
    local_73 = 0;
    local_9a = 0;
    local_9b = 0;
    it._M_node._6_1_ = 0;
    it._M_node._5_1_ = 0;
    std::__cxx11::string::string((string *)&local_38,"u_time",&local_39);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
             ::operator[](&this->functions,&local_38);
    local_109 = 1;
    if ((pmVar2->present & 1U) == 0) {
      std::allocator<char>::allocator();
      local_72 = 1;
      std::__cxx11::string::string((string *)&local_70,"u_date",&local_71);
      local_73 = 1;
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
               ::operator[](&this->functions,&local_70);
      local_109 = 1;
      if ((pmVar2->present & 1U) == 0) {
        std::allocator<char>::allocator();
        local_9a = 1;
        std::__cxx11::string::string((string *)&local_98,"u_delta",&local_99);
        local_9b = 1;
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                 ::operator[](&this->functions,&local_98);
        local_109 = 1;
        if ((pmVar2->present & 1U) == 0) {
          std::allocator<char>::allocator();
          it._M_node._6_1_ = 1;
          std::__cxx11::string::string
                    ((string *)&local_c0,"u_mouse",(allocator *)((long)&it._M_node + 7));
          it._M_node._5_1_ = 1;
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                   ::operator[](&this->functions,&local_c0);
          local_109 = pmVar2->present;
        }
      }
    }
    if ((it._M_node._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_c0);
    }
    if ((it._M_node._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
    }
    if ((local_9b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_98);
    }
    if ((local_9a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    if ((local_73 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_70);
    }
    if ((local_72 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if ((local_109 & 1) == 0) {
      local_d8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
           ::begin(&(this->super_Scene).lights);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
      ::_Rb_tree_const_iterator(&local_d0,&local_d8);
      while( true ) {
        local_e8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
             ::end(&(this->super_Scene).lights);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
        ::_Rb_tree_const_iterator(&local_e0,&local_e8);
        bVar1 = std::operator!=(&local_d0,&local_e0);
        if (!bVar1) break;
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                 ::operator->(&local_d0);
        if (((ppVar3->second->super_Node).bChange & 1U) != 0) {
          return true;
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
        ::operator++(&local_d0);
      }
      if (((this->m_change & 1U) == 0) &&
         (sVar4 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
                  ::size(&(this->super_Scene).streams), sVar4 == 0)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Uniforms::haveChange() { 
    if (activeCamera)
        if (activeCamera->bChange)
            return true;
            
    if (functions["u_time"].present || 
        functions["u_date"].present ||
        functions["u_delta"].present ||
        functions["u_mouse"].present)
        return true;

    for (vera::LightsMap::const_iterator it = lights.begin(); it != lights.end(); ++it)
        if (it->second->bChange)
            return true;

    if (m_change || streams.size() > 0)
        return true;

    return false;
}